

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O1

void smatvec(int ldm,int nrow,int ncol,float *M,float *vec,float *Mxvec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  float *pfVar12;
  ulong uVar13;
  float *pfVar14;
  float *pfVar15;
  
  uVar9 = 0;
  if (7 < ncol) {
    lVar11 = (long)ldm;
    uVar9 = 0;
    do {
      if (0 < nrow) {
        fVar1 = vec[uVar9];
        fVar2 = vec[uVar9 + 1];
        fVar3 = vec[uVar9 + 2];
        fVar4 = vec[uVar9 + 3];
        fVar5 = vec[uVar9 + 4];
        fVar6 = vec[uVar9 + 5];
        fVar7 = vec[uVar9 + 6];
        fVar8 = vec[uVar9 + 7];
        uVar13 = 0;
        do {
          pfVar14 = M + uVar13;
          Mxvec[uVar13] =
               pfVar14[lVar11 * 7] * fVar8 +
               pfVar14[lVar11 * 6] * fVar7 +
               pfVar14[lVar11 * 5] * fVar6 +
               pfVar14[lVar11 * 4] * fVar5 +
               pfVar14[lVar11 * 3] * fVar4 +
               pfVar14[lVar11 * 2] * fVar3 + *pfVar14 * fVar1 + pfVar14[lVar11] * fVar2 +
               Mxvec[uVar13];
          uVar13 = uVar13 + 1;
        } while ((uint)nrow != uVar13);
      }
      uVar9 = uVar9 + 8;
      M = M + ldm * 8;
    } while ((long)uVar9 < (long)(ncol + -7));
  }
  if ((int)uVar9 < ncol + -3) {
    lVar11 = (long)ldm;
    iVar10 = ldm * 4;
    uVar9 = uVar9 & 0xffffffff;
    pfVar14 = M + lVar11 * 3;
    pfVar15 = M + lVar11 * 2;
    pfVar12 = M + lVar11;
    do {
      if (0 < nrow) {
        fVar1 = vec[uVar9];
        fVar2 = vec[uVar9 + 1];
        fVar3 = vec[uVar9 + 2];
        fVar4 = vec[uVar9 + 3];
        uVar13 = 0;
        do {
          Mxvec[uVar13] =
               pfVar14[uVar13] * fVar4 +
               pfVar15[uVar13] * fVar3 + M[uVar13] * fVar1 + pfVar12[uVar13] * fVar2 + Mxvec[uVar13]
          ;
          uVar13 = uVar13 + 1;
        } while ((uint)nrow != uVar13);
      }
      uVar9 = uVar9 + 4;
      M = M + iVar10;
      pfVar14 = pfVar14 + iVar10;
      pfVar15 = pfVar15 + iVar10;
      pfVar12 = pfVar12 + iVar10;
    } while ((long)uVar9 < (long)(ncol + -3));
  }
  if ((int)uVar9 < ncol) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      if (0 < nrow) {
        fVar1 = vec[uVar9];
        uVar13 = 0;
        do {
          Mxvec[uVar13] = M[uVar13] * fVar1 + Mxvec[uVar13];
          uVar13 = uVar13 + 1;
        } while ((uint)nrow != uVar13);
      }
      uVar9 = uVar9 + 1;
      M = M + ldm;
    } while (uVar9 != (uint)ncol);
  }
  return;
}

Assistant:

void smatvec (int ldm, int nrow, int ncol, float *M, float *vec, float *Mxvec)
{
    float vi0, vi1, vi2, vi3, vi4, vi5, vi6, vi7;
    float *M0;
    register float *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;
    int k;

    M0 = &M[0];
    while ( firstcol < ncol - 7 ) {	/* Do 8 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
        Mki2 = Mki1 + ldm;
        Mki3 = Mki2 + ldm;
	Mki4 = Mki3 + ldm;
	Mki5 = Mki4 + ldm;
	Mki6 = Mki5 + ldm;
	Mki7 = Mki6 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	vi4 = vec[firstcol++];
	vi5 = vec[firstcol++];
	vi6 = vec[firstcol++];
	vi7 = vec[firstcol++];	

	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ 
		      + vi4 * *Mki4++ + vi5 * *Mki5++
		      + vi6 * *Mki6++ + vi7 * *Mki7++;

	M0 += 8 * ldm;
    }

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ ;

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */

 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++)
	    Mxvec[k] += vi0 * *Mki0++;

	M0 += ldm;
    }
	
}